

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd2copypal.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long lVar2;
  long lVar3;
  FILE *out;
  FILE *in;
  gdImagePtr pal;
  gdImagePtr im;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    fprintf(_stderr,"Usage: gd2copypal palettefile.gd2 filename.gd2\n");
    exit(1);
  }
  pFVar1 = fopen(argv[1],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Palette file does not exist!\n");
    exit(1);
  }
  lVar2 = gdImageCreateFromGd2(pFVar1);
  fclose(pFVar1);
  if (lVar2 == 0) {
    fprintf(_stderr,"Palette is not in GD2 format!\n");
    exit(1);
  }
  pFVar1 = fopen(argv[2],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Input file does not exist!\n");
    exit(1);
  }
  lVar3 = gdImageCreateFromGd2(pFVar1);
  fclose(pFVar1);
  if (lVar3 == 0) {
    fprintf(_stderr,"Input is not in GD2 format!\n");
    exit(1);
  }
  gdImagePaletteCopy(lVar3,lVar2);
  pFVar1 = fopen(argv[2],"wb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Output file cannot be written to!\n");
    gdImageDestroy(lVar3);
    exit(1);
  }
  gdImageGd2(lVar3,pFVar1,0x80,2);
  fclose(pFVar1);
  gdImageDestroy(lVar2);
  gdImageDestroy(lVar3);
  return 0;
}

Assistant:

int
main (int argc, char **argv)
{
	gdImagePtr im;
	gdImagePtr pal;
	FILE *in, *out;
	if (argc != 3) {
		fprintf(stderr, "Usage: gd2copypal palettefile.gd2 filename.gd2\n");
		exit (1);
	}
	in = fopen (argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Palette file does not exist!\n");
		exit (1);
	}
	pal = gdImageCreateFromGd2 (in);
	fclose (in);
	if (!pal) {
		fprintf(stderr, "Palette is not in GD2 format!\n");
		exit (1);
	}

	in = fopen (argv[2], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit (1);
	}
	im = gdImageCreateFromGd2 (in);
	fclose (in);
	if (!im) {
		fprintf(stderr, "Input is not in GD2 format!\n");
		exit (1);
	}

	gdImagePaletteCopy (im, pal);

	out = fopen (argv[2], "wb");
	if (!out) {
		fprintf(stderr, "Output file cannot be written to!\n");
		gdImageDestroy (im);
		exit (1);
	}
	gdImageGd2 (im, out, 128, 2);
	fclose (out);
	gdImageDestroy (pal);
	gdImageDestroy (im);

	return 0;
}